

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O2

bool __thiscall bloaty::dwarf::LineInfoReader::ReadLineInfo(LineInfoReader *this)

{
  uint32_t *puVar1;
  bool *pbVar2;
  uint8_t uVar3;
  char cVar4;
  size_t sVar5;
  byte bVar6;
  uchar uVar7;
  unsigned_short uVar8;
  int iVar9;
  uint uVar10;
  unsigned_long amount;
  uint64_t uVar11;
  ulong uVar12;
  char *__format;
  value_type local_78;
  string_view data;
  
  (this->info_).discriminator = 0;
  (this->info_).end_sequence = false;
  (this->info_).basic_block = false;
  (this->info_).prologue_end = false;
  (this->info_).epilogue_begin = false;
  data._M_len = (this->remaining_)._M_len;
  data._M_str = (this->remaining_)._M_str;
  do {
    while( true ) {
      sVar5 = data._M_len;
      if (data._M_len == 0) goto LAB_001970b0;
      bVar6 = ReadFixed<unsigned_char,1ul>(&data);
      uVar10 = (uint)bVar6;
      if ((this->params_).opcode_base <= bVar6) break;
      switch((ulong)uVar10) {
      case 0:
        uVar8 = ReadLEB128<unsigned_short>(&data);
        bVar6 = ReadFixed<unsigned_char,1ul>(&data);
        uVar12 = (ulong)bVar6;
        switch(bVar6) {
        case 1:
          uVar3 = (this->params_).default_is_stmt;
          (this->info_).file = 1;
          (this->info_).line = 1;
          (this->info_).end_sequence = false;
          (this->info_).basic_block = false;
          (this->info_).prologue_end = false;
          (this->info_).epilogue_begin = false;
          (this->info_).column = 0;
          (this->info_).discriminator = 0;
          (this->info_).is_stmt = uVar3 != '\0';
          (this->info_).op_index = '\0';
          (this->info_).isa = '\0';
          (this->info_).end_sequence = true;
          cVar4 = this->shadow_;
          goto joined_r0x00196e5e;
        case 2:
          uVar11 = CompilationUnitSizes::ReadAddress(&this->sizes_,&data);
          (this->info_).address = uVar11;
          (this->info_).op_index = '\0';
          this->shadow_ = uVar11 == 0;
          break;
        case 3:
          local_78.name = (string_view)ZEXT816(0);
          local_78.name = ReadNullTerminated(&data);
          local_78.directory_index = ReadLEB128<unsigned_int>(&data);
          local_78.modified_time = ReadLEB128<unsigned_long>(&data);
          local_78.file_size = ReadLEB128<unsigned_long>(&data);
          if ((ulong)((long)(this->include_directories_).
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->include_directories_).
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <=
              (ulong)local_78.directory_index) {
            Throw("directory index out of range",0xd1);
          }
          std::
          vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
          ::push_back(&this->filenames_,&local_78);
          break;
        case 4:
          uVar10 = ReadLEB128<unsigned_int>(&data);
          (this->info_).discriminator = uVar10;
          break;
        default:
          ReadBytes((ulong)uVar8,&data);
          if (0 < verbose_level) {
            __format = "bloaty: warning: unknown DWARF line table extended opcode: %d\n";
            goto LAB_00196f8c;
          }
        }
        break;
      case 1:
        goto switchD_00196de1_caseD_1;
      case 2:
        amount = ReadLEB128<unsigned_long>(&data);
        Advance(this,amount);
        break;
      case 3:
        iVar9 = ReadLEB128<int>(&data);
        puVar1 = &(this->info_).line;
        *puVar1 = *puVar1 + iVar9;
        break;
      case 4:
        uVar10 = ReadLEB128<unsigned_int>(&data);
        (this->info_).file = uVar10;
        if ((ulong)(((long)(this->filenames_).
                           super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->filenames_).
                          super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar10) {
          Throw("filename index too big",0xf5);
        }
        break;
      case 5:
        uVar10 = ReadLEB128<unsigned_int>(&data);
        (this->info_).column = uVar10;
        break;
      case 6:
        pbVar2 = &(this->info_).is_stmt;
        *pbVar2 = (bool)(*pbVar2 ^ 1);
        break;
      case 7:
        (this->info_).basic_block = true;
        break;
      case 8:
        SpecialOpcodeAdvance(this,0xff);
        break;
      case 9:
        uVar8 = ReadFixed<unsigned_short,2ul>(&data);
        (this->info_).address = (this->info_).address + (ulong)uVar8;
        (this->info_).op_index = '\0';
        break;
      case 10:
        (this->info_).prologue_end = true;
        break;
      case 0xb:
        (this->info_).epilogue_begin = true;
        break;
      case 0xc:
        uVar7 = ReadLEB128<unsigned_char>(&data);
        (this->info_).isa = uVar7;
        break;
      default:
        ReadBytes((ulong)(this->standard_opcode_lengths_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10],&data);
        if (0 < verbose_level) {
          __format = "bloaty: warning: unknown DWARF line table opcode: %d\n";
          uVar12 = (ulong)uVar10;
LAB_00196f8c:
          fprintf(_stderr,__format,uVar12);
        }
      }
    }
    SpecialOpcodeAdvance(this,bVar6);
    puVar1 = &(this->info_).line;
    *puVar1 = *puVar1 + (uint)((byte)(bVar6 - (this->params_).opcode_base) %
                              (this->params_).line_range) + (int)(this->params_).line_base;
switchD_00196de1_caseD_1:
    cVar4 = this->shadow_;
joined_r0x00196e5e:
    if (cVar4 == '\0') {
LAB_001970b0:
      (this->remaining_)._M_len = data._M_len;
      (this->remaining_)._M_str = data._M_str;
      return sVar5 != 0;
    }
  } while( true );
}

Assistant:

bool LineInfoReader::ReadLineInfo() {
  // Final step of last DW_LNS_copy / special opcode.
  info_.discriminator = 0;
  info_.basic_block = false;
  info_.prologue_end = false;
  info_.epilogue_begin = false;

  // Final step of DW_LNE_end_sequence.
  info_.end_sequence = false;

  string_view data = remaining_;

  while (true) {
    if (data.empty()) {
      remaining_ = data;
      return false;
    }

    uint8_t op = ReadFixed<uint8_t>(&data);

    if (op >= params_.opcode_base) {
      SpecialOpcodeAdvance(op);
      info_.line +=
          params_.line_base + (AdjustedOpcode(op) % params_.line_range);
      if (!shadow_) {
        remaining_ = data;
        return true;
      }
    } else {
      switch (op) {
        case DW_LNS_extended_op: {
          uint16_t len = ReadLEB128<uint16_t>(&data);
          uint8_t extended_op = ReadFixed<uint8_t>(&data);
          switch (extended_op) {
            case DW_LNE_end_sequence: {
              // Preserve address and set end_sequence, but reset everything
              // else.
              uint64_t addr = info_.address;
              info_ = LineInfo(params_.default_is_stmt);
              info_.address = addr;
              info_.end_sequence = true;
              if (!shadow_) {
                remaining_ = data;
                return true;
              }
              break;
            }
            case DW_LNE_set_address:
              info_.address = sizes_.ReadAddress(&data);
              info_.op_index = 0;
              shadow_ = (info_.address == 0);
              break;
            case DW_LNE_define_file: {
              FileName file_name;
              file_name.name = ReadNullTerminated(&data);
              file_name.directory_index = ReadLEB128<uint32_t>(&data);
              file_name.modified_time = ReadLEB128<uint64_t>(&data);
              file_name.file_size = ReadLEB128<uint64_t>(&data);
              if (file_name.directory_index >= include_directories_.size()) {
                THROW("directory index out of range");
              }
              filenames_.push_back(file_name);
              break;
            }
            case DW_LNE_set_discriminator:
              info_.discriminator = ReadLEB128<uint32_t>(&data);
              break;
            default:
              // We don't understand this opcode, skip it.
              SkipBytes(len, &data);
              if (verbose_level > 0) {
                fprintf(stderr,
                        "bloaty: warning: unknown DWARF line table extended "
                        "opcode: %d\n",
                        extended_op);
              }
              break;
          }
          break;
        }
        case DW_LNS_copy:
          if (!shadow_) {
            remaining_ = data;
            return true;
          }
          break;
        case DW_LNS_advance_pc:
          Advance(ReadLEB128<uint64_t>(&data));
          break;
        case DW_LNS_advance_line:
          info_.line += ReadLEB128<int32_t>(&data);
          break;
        case DW_LNS_set_file:
          info_.file = ReadLEB128<uint32_t>(&data);
          if (info_.file >= filenames_.size()) {
            THROW("filename index too big");
          }
          break;
        case DW_LNS_set_column:
          info_.column = ReadLEB128<uint32_t>(&data);
          break;
        case DW_LNS_negate_stmt:
          info_.is_stmt = !info_.is_stmt;
          break;
        case DW_LNS_set_basic_block:
          info_.basic_block = true;
          break;
        case DW_LNS_const_add_pc:
          SpecialOpcodeAdvance(255);
          break;
        case DW_LNS_fixed_advance_pc:
          info_.address += ReadFixed<uint16_t>(&data);
          info_.op_index = 0;
          break;
        case DW_LNS_set_prologue_end:
          info_.prologue_end = true;
          break;
        case DW_LNS_set_epilogue_begin:
          info_.epilogue_begin = true;
          break;
        case DW_LNS_set_isa:
          info_.isa = ReadLEB128<uint8_t>(&data);
          break;
        default:
          // Unknown opcode, but we know its length so can skip it.
          SkipBytes(standard_opcode_lengths_[op], &data);
          if (verbose_level > 0) {
            fprintf(stderr,
                    "bloaty: warning: unknown DWARF line table opcode: %d\n",
                    op);
          }
          break;
      }
    }
  }
}